

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

void __thiscall
QtPrivate::QCalendarDateValidator::QCalendarDateValidator(QCalendarDateValidator *this)

{
  qint64 qVar1;
  
  (this->m_tokens).
  super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tokens).
  super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_separators).d.size = 0;
  (this->m_tokens).
  super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_separators).d.d = (Data *)0x0;
  (this->m_separators).d.ptr = (QString *)0x0;
  (this->m_yearValidator).super_QCalendarDateSectionValidator._vptr_QCalendarDateSectionValidator =
       (_func_int **)&PTR__QCalendarDateSectionValidator_007ef540;
  QLocale::QLocale(&(this->m_yearValidator).super_QCalendarDateSectionValidator.m_locale);
  (this->m_yearValidator).super_QCalendarDateSectionValidator._vptr_QCalendarDateSectionValidator =
       (_func_int **)&PTR__QCalendarDateSectionValidator_007ee558;
  (this->m_yearValidator).m_pos = 0;
  (this->m_yearValidator).m_year = 2000;
  (this->m_yearValidator).m_oldYear = 2000;
  (this->m_monthValidator).super_QCalendarDateSectionValidator._vptr_QCalendarDateSectionValidator =
       (_func_int **)&PTR__QCalendarDateSectionValidator_007ef540;
  QLocale::QLocale(&(this->m_monthValidator).super_QCalendarDateSectionValidator.m_locale);
  (this->m_monthValidator).super_QCalendarDateSectionValidator._vptr_QCalendarDateSectionValidator =
       (_func_int **)&PTR__QCalendarDateSectionValidator_007ee510;
  (this->m_monthValidator).m_pos = 0;
  (this->m_monthValidator).m_month = 1;
  (this->m_monthValidator).m_oldMonth = 1;
  (this->m_dayValidator).super_QCalendarDateSectionValidator._vptr_QCalendarDateSectionValidator =
       (_func_int **)&PTR__QCalendarDateSectionValidator_007ef540;
  QLocale::QLocale(&(this->m_dayValidator).super_QCalendarDateSectionValidator.m_locale);
  (this->m_dayValidator).super_QCalendarDateSectionValidator._vptr_QCalendarDateSectionValidator =
       (_func_int **)&PTR__QCalendarDateSectionValidator_007ee4c8;
  (this->m_dayValidator).m_pos = 0;
  (this->m_dayValidator).m_day = 1;
  (this->m_dayValidator).m_oldDay = 1;
  this->m_currentToken = -1;
  qVar1 = QDate::currentDate();
  (this->m_initialDate).jd = qVar1;
  (this->m_currentDate).jd = qVar1;
  this->m_lastSectionMove = ThisSection;
  return;
}

Assistant:

QCalendarDateValidator::QCalendarDateValidator()
    : m_currentToken(-1),
      m_initialDate(QDate::currentDate()),
      m_currentDate(m_initialDate),
      m_lastSectionMove(QCalendarDateSectionValidator::ThisSection)
{
}